

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedSyncTextureUpdate::Setup(AdvancedSyncTextureUpdate *this)

{
  AdvancedSyncTextureUpdate *this_local;
  
  this->m_texture = 0;
  this->m_store_program = 0;
  this->m_draw_program = 0;
  this->m_vao = 0;
  this->m_vbo = 0;
  this->m_pbo = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_texture		= 0;
		m_store_program = 0;
		m_draw_program  = 0;
		m_vao			= 0;
		m_vbo			= 0;
		m_pbo			= 0;
		return NO_ERROR;
	}